

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_verifier.cpp
# Opt level: O1

FUNCTION_RETURN __thiscall
license::LicenseVerifier::verify_limits(LicenseVerifier *this,FullLicenseInfo *lic_info)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  EventRegistry *pEVar4;
  char *licenseLocationId;
  bool bVar5;
  LCC_EVENT_TYPE event;
  const_iterator cVar6;
  time_t tVar7;
  FUNCTION_RETURN FVar8;
  key_type local_60;
  char *local_40;
  LicenseVerifier *local_38;
  
  uVar3 = lic_info->m_magic;
  if (uVar3 != 0) {
    EventRegistry::addEvent
              (this->m_event_registry,IFF_LOOPBACK,(lic_info->source)._M_dataplus._M_p,(char *)0x0);
  }
  local_40 = (char *)time((time_t *)0x0);
  paVar2 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"valid-to","");
  this_00 = &lic_info->m_limits;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  local_38 = this;
  if (uVar3 == 0) {
    bVar5 = true;
    if ((_Rb_tree_header *)cVar6._M_node == &(lic_info->m_limits)._M_t._M_impl.super__Rb_tree_header
       ) goto LAB_00188c63;
    tVar7 = seconds_from_epoch((string *)(cVar6._M_node + 2));
    if ((long)local_40 <= tVar7) goto LAB_00188c63;
    pEVar4 = local_38->m_event_registry;
    licenseLocationId = (lic_info->source)._M_dataplus._M_p;
    std::operator+(&local_60,"Expired ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (cVar6._M_node + 2));
    EventRegistry::addEvent(pEVar4,PRODUCT_EXPIRED,licenseLocationId,local_60._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  bVar5 = false;
LAB_00188c63:
  local_60._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"valid-from","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  p_Var1 = &(lic_info->m_limits)._M_t._M_impl.super__Rb_tree_header;
  if ((bool)((_Rb_tree_header *)cVar6._M_node != p_Var1 & bVar5)) {
    tVar7 = seconds_from_epoch((string *)(cVar6._M_node + 2));
    if ((long)local_40 < tVar7) {
      pEVar4 = local_38->m_event_registry;
      local_40 = (lic_info->source)._M_dataplus._M_p;
      std::operator+(&local_60,"Valid from ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (cVar6._M_node + 2));
      EventRegistry::addEvent(pEVar4,PRODUCT_EXPIRED,local_40,local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      bVar5 = false;
    }
  }
  local_60._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"client-signature","");
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  FVar8 = FUNC_RET_ERROR;
  if (bVar5) {
    if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
      FVar8 = FUNC_RET_OK;
    }
    else {
      event = hw_identifier::HwIdentifierFacade::validate_pc_signature
                        ((string *)(cVar6._M_node + 2));
      EventRegistry::addEvent(local_38->m_event_registry,event,&lic_info->source);
      FVar8 = (uint)(event != LICENSE_OK) * 2;
    }
  }
  return FVar8;
}

Assistant:

FUNCTION_RETURN LicenseVerifier::verify_limits(const FullLicenseInfo& lic_info) {
	bool is_valid = LCC_VERIFY_MAGIC;
	if (!is_valid) {
		m_event_registry.addEvent(LICENSE_CORRUPTED, lic_info.source.c_str());
	}
	const time_t now = time(nullptr);
	auto expiry = lic_info.m_limits.find(PARAM_EXPIRY_DATE);
	if (is_valid && expiry != lic_info.m_limits.end()) {
		if (seconds_from_epoch(expiry->second) < now) {
			m_event_registry.addEvent(PRODUCT_EXPIRED, lic_info.source.c_str(), ("Expired " + expiry->second).c_str());
			is_valid = false;
		}
	}
	const auto start_date = lic_info.m_limits.find(PARAM_BEGIN_DATE);
	if (is_valid && start_date != lic_info.m_limits.end()) {
		if (seconds_from_epoch(start_date->second) > now) {
			m_event_registry.addEvent(PRODUCT_EXPIRED, lic_info.source.c_str(),
									  ("Valid from " + start_date->second).c_str());
			is_valid = false;
		}
	}
	const auto client_sig = lic_info.m_limits.find(PARAM_CLIENT_SIGNATURE);
	if (is_valid && client_sig != lic_info.m_limits.end()) {
		const LCC_EVENT_TYPE event = hw_identifier::HwIdentifierFacade::validate_pc_signature(client_sig->second);
		m_event_registry.addEvent(event, lic_info.source);
		is_valid = is_valid && (event == LICENSE_OK);
	}
	return is_valid ? FUNC_RET_OK : FUNC_RET_ERROR;
}